

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_rgb565D_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                        JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  JSAMPLE *pJVar4;
  JSAMPARRAY ppJVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  JSAMPROW outptr;
  uint b_1;
  uint g_1;
  uint r_1;
  JLONG rgb_1;
  JLONG d0_1;
  JDIMENSION num_cols_1;
  JSAMPLE *range_limit_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JSAMPROW outptr_1;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  int test_value;
  uint b;
  uint g;
  uint r;
  JLONG rgb;
  JLONG d0;
  uint *puStack_30;
  JDIMENSION num_cols;
  JSAMPLE *range_limit;
  JSAMPARRAY ppJStack_20;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  
  pJVar4 = cinfo->sample_range_limit;
  cinfo_local._4_4_ = cinfo->output_width;
  input_buf_local = (JSAMPIMAGE)dither_matrix[cinfo->output_scanline & 3];
  range_limit._4_4_ = num_rows;
  ppJStack_20 = output_buf;
  inptr2._4_4_ = input_row;
  while (range_limit._4_4_ = range_limit._4_4_ + -1, -1 < range_limit._4_4_) {
    pbVar7 = (*input_buf)[inptr2._4_4_];
    pbVar9 = input_buf[1][inptr2._4_4_];
    pbVar11 = input_buf[2][inptr2._4_4_];
    inptr2._4_4_ = inptr2._4_4_ + 1;
    ppJVar5 = ppJStack_20 + 1;
    puStack_30 = (uint *)*ppJStack_20;
    _g = pbVar11;
    rgb = (JLONG)pbVar9;
    d0 = (JLONG)pbVar7;
    if (((ulong)puStack_30 & 3) != 0) {
      d0 = (JLONG)(pbVar7 + 1);
      rgb = (JLONG)(pbVar9 + 1);
      _g = pbVar11 + 1;
      *(ushort *)puStack_30 =
           (pJVar4[(ulong)*pbVar7 + ((ulong)input_buf_local & 0xff)] & 0xf8) << 8 |
           (pJVar4[(ulong)*pbVar9 + ((long)((ulong)input_buf_local & 0xff) >> 1)] & 0xfc) << 3 |
           (ushort)(pJVar4[(ulong)*pbVar11 + ((ulong)input_buf_local & 0xff)] >> 3);
      puStack_30 = (uint *)((long)puStack_30 + 2);
      cinfo_local._4_4_ = cinfo_local._4_4_ - 1;
    }
    for (b = 0; b < cinfo_local._4_4_ >> 1; b = b + 1) {
      pbVar7 = (byte *)(d0 + 1);
      bVar1 = *(byte *)d0;
      uVar8 = (ulong)input_buf_local & 0xff;
      pbVar9 = (byte *)(rgb + 1);
      bVar2 = *(byte *)rgb;
      uVar10 = (ulong)input_buf_local & 0xff;
      pbVar11 = _g + 1;
      bVar3 = *_g;
      uVar12 = (ulong)input_buf_local & 0xff;
      uVar6 = (long)input_buf_local >> 8;
      d0 = d0 + 2;
      rgb = rgb + 2;
      _g = _g + 2;
      input_buf_local =
           (JSAMPIMAGE)
           ((uVar6 & 0xff) << 0x18 |
           (long)(((ulong)input_buf_local & 0xff) << 0x18 | uVar6 & 0xffffff) >> 8);
      *puStack_30 = ((pJVar4[(ulong)*pbVar7 + (uVar6 & 0xff)] & 0xf8) << 8 |
                     (pJVar4[(ulong)*pbVar9 + ((long)(uVar6 & 0xff) >> 1)] & 0xfc) << 3 |
                    (uint)(pJVar4[(ulong)*pbVar11 + (uVar6 & 0xff)] >> 3)) << 0x10 |
                    (pJVar4[bVar1 + uVar8] & 0xf8) << 8 |
                    (pJVar4[(ulong)bVar2 + ((long)uVar10 >> 1)] & 0xfc) << 3 |
                    (uint)(pJVar4[bVar3 + uVar12] >> 3);
      puStack_30 = puStack_30 + 1;
    }
    ppJStack_20 = ppJVar5;
    if ((cinfo_local._4_4_ & 1) != 0) {
      *(ushort *)puStack_30 =
           (pJVar4[(ulong)*(byte *)d0 + ((ulong)input_buf_local & 0xff)] & 0xf8) << 8 |
           (pJVar4[(ulong)*(byte *)rgb + ((long)((ulong)input_buf_local & 0xff) >> 1)] & 0xfc) << 3
           | (ushort)(pJVar4[(ulong)*_g + ((ulong)input_buf_local & 0xff)] >> 3);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb565D_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                    JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    rgb_rgb565D_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    rgb_rgb565D_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}